

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetItemDefaultFocus(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImVec2 local_38;
  ImVec2 local_30;
  ImRect local_28;
  ImGuiWindow *local_18;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window = (ImGuiWindow *)GImGui;
  local_18 = GImGui->CurrentWindow;
  if (((((local_18->Appearing & 1U) != 0) && (GImGui->NavWindow == local_18->RootWindowForNav)) &&
      (((GImGui->NavInitRequest & 1U) != 0 || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (local_18->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar1->NavInitResultId = (local_18->DC).LastItemId;
    local_30 = operator-(&(local_18->DC).LastItemRect.Min,&local_18->Pos);
    local_38 = operator-(&(local_18->DC).LastItemRect.Max,&local_18->Pos);
    ImRect::ImRect(&local_28,&local_30,&local_38);
    window[7].DrawListInst._IdxWritePtr = (ImDrawIdx *)local_28.Min;
    window[7].DrawListInst._ClipRectStack.Size = (int)local_28.Max.x;
    window[7].DrawListInst._ClipRectStack.Capacity = (int)local_28.Max.y;
    NavUpdateAnyRequestFlag();
    bVar2 = IsItemVisible();
    if (!bVar2) {
      SetScrollHereY(0.5);
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == window->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = window->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHereY();
    }
}